

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void __thiscall
Test_TemplateModifiers_ValidateImgSrcUrlJavascriptEscape::
Test_TemplateModifiers_ValidateImgSrcUrlJavascriptEscape
          (Test_TemplateModifiers_ValidateImgSrcUrlJavascriptEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlJavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlJavascriptEscape", NULL);
  dict.SetEscapedValue(
      "easy http URL", "http://www.google.com",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder https URL",
      "https://www.google.com/search?q=f&hl=en",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled http URL", "HTTP://www.google.com",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy javascript URL",
      "javascript:alert(document.cookie)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder javascript URL",
      "javascript:alert(10/5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy relative URL",
      "foobar.html",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder relative URL",
      "/search?q=green flowers&hl=en",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "data URL",
      "data: text/html",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled javascript URL",
      "javaSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder mangled javascript URL",
      "java\nSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_img_src_url_and_javascript_escape);


  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q\\x3df\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("mangled http URL"),
               "HTTP://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q\\x3dgreen flowers\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("data URL"),
               "/images/cleardot.gif");
  EXPECT_STREQ(peer.GetSectionValue("mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
}